

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  XmlWriter *this_00;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  GroupInfo *local_18;
  GroupInfo *groupInfo_local;
  XmlReporter *this_local;
  
  local_18 = groupInfo;
  groupInfo_local = (GroupInfo *)this;
  StreamingReporterBase::testGroupStarting(&this->super_StreamingReporterBase,groupInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Group",&local_39);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  XmlWriter::writeAttribute(this_00,&local_70,&local_18->name);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testGroupStarting( groupInfo );
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupInfo.name );
        }